

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.cpp
# Opt level: O0

void __thiscall icu_63::UVector64::setSize(UVector64 *this,int32_t newSize)

{
  UBool UVar1;
  UErrorCode local_1c;
  UErrorCode local_18;
  UErrorCode ec;
  int32_t i;
  int32_t newSize_local;
  UVector64 *this_local;
  
  if (-1 < newSize) {
    ec = newSize;
    if (this->count < newSize) {
      local_1c = U_ZERO_ERROR;
      _i = this;
      UVar1 = ensureCapacity(this,newSize,&local_1c);
      if (UVar1 == '\0') {
        return;
      }
      for (local_18 = this->count; local_18 < ec; local_18 = local_18 + U_ILLEGAL_ARGUMENT_ERROR) {
        this->elements[local_18] = 0;
      }
    }
    this->count = ec;
  }
  return;
}

Assistant:

void UVector64::setSize(int32_t newSize) {
    int32_t i;
    if (newSize < 0) {
        return;
    }
    if (newSize > count) {
        UErrorCode ec = U_ZERO_ERROR;
        if (!ensureCapacity(newSize, ec)) {
            return;
        }
        for (i=count; i<newSize; ++i) {
            elements[i] = 0;
        }
    } 
    count = newSize;
}